

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::AbortingErrorCollector::RecordError
          (AbortingErrorCollector *this,string_view filename,string_view element_name,
          Message *message,ErrorLocation location,string_view error_message)

{
  LogMessage *pLVar1;
  LogMessage LStack_38;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x36be);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&LStack_38,(char (*) [33])"AddError() called unexpectedly: ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,filename);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0xef943b);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,element_name);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [4])0x114380f);
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,error_message);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void RecordError(absl::string_view filename, absl::string_view element_name,
                   const Message* message, ErrorLocation location,
                   absl::string_view error_message) override {
    ABSL_LOG(FATAL) << "AddError() called unexpectedly: " << filename << " ["
                    << element_name << "]: " << error_message;
  }